

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# psbt.c
# Opt level: O1

_Bool finalize_p2sh_wrapped(wally_psbt_input *input)

{
  int iVar1;
  size_t size;
  uchar *bytes_out;
  size_t push_len;
  size_t local_20;
  
  size = script_get_push_size(input->redeem_script_len);
  bytes_out = (uchar *)wally_malloc(size);
  if ((bytes_out != (uchar *)0x0) &&
     (iVar1 = wally_script_push_from_bytes
                        (input->redeem_script,input->redeem_script_len,0,bytes_out,size,&local_20),
     iVar1 == 0)) {
    input->final_scriptsig = bytes_out;
    input->final_scriptsig_len = local_20;
    return true;
  }
  wally_free(bytes_out);
  wally_tx_witness_stack_free(input->final_witness);
  input->final_witness = (wally_tx_witness_stack *)0x0;
  return false;
}

Assistant:

static bool finalize_p2sh_wrapped(struct wally_psbt_input *input)
{
    unsigned char *script;
    size_t script_len, push_len;

    /* P2SH wrapped witness: add scriptSig pushing the redeemScript */
    script_len = script_get_push_size(input->redeem_script_len);
    if ((script = wally_malloc(script_len)) != NULL &&
        wally_script_push_from_bytes(input->redeem_script,
                                     input->redeem_script_len, 0,
                                     script, script_len,
                                     &push_len) == WALLY_OK) {
        input->final_scriptsig = script;
        input->final_scriptsig_len = push_len;
        return true;
    }
    /* Failed: clear caller-created witness stack before returning */
    wally_free(script);
    wally_tx_witness_stack_free(input->final_witness);
    input->final_witness = NULL;
    return false;
}